

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O3

int big_file_mpi_create_block
              (BigFile *bf,BigBlock *block,char *blockname,char *dtype,int nmemb,int Nfile,
              size_t size,MPI_Comm comm)

{
  long lVar1;
  char *dtype_00;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long alStack_60 [3];
  long lStack_48;
  char *local_40;
  int local_34;
  
  local_34 = nmemb;
  local_40 = dtype;
  uVar5 = (ulong)(uint)Nfile;
  lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
  if (0 < Nfile) {
    lVar3 = uVar5 - 1;
    auVar6._8_4_ = (int)lVar3;
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar6 = auVar6 ^ _DAT_0010c170;
    uVar4 = 0;
    auVar7 = _DAT_0010c160;
    do {
      auVar8 = auVar7 ^ _DAT_0010c170;
      lVar9 = auVar7._8_8_;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(ulong *)((long)&lStack_48 + lVar1 + lVar3) =
             ((auVar7._0_8_ + 1) * size) / uVar5 - uVar4 / uVar5;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(ulong *)((long)&local_40 + lVar3 + lVar1) =
             ((lVar9 + 1) * size) / uVar5 - (uVar4 + size) / uVar5;
      }
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar9 + 2;
      uVar4 = uVar4 + size * 2;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(Nfile + 1U >> 1) << 4 != lVar3);
  }
  iVar2 = local_34;
  dtype_00 = local_40;
  *(MPI_Comm *)((long)alStack_60 + lVar1 + 0x10) = comm;
  *(long *)((long)alStack_60 + lVar1 + 8) = (long)&lStack_48 + lVar1;
  *(undefined8 *)((long)alStack_60 + lVar1) = 0x104360;
  iVar2 = _big_file_mpi_create_block
                    (bf,block,blockname,dtype_00,iVar2,Nfile,
                     *(size_t **)((long)alStack_60 + lVar1 + 8),
                     *(MPI_Comm *)((long)alStack_60 + lVar1 + 0x10));
  return iVar2;
}

Assistant:

int
_big_file_mpi_create_block(BigFile * bf,
        BigBlock * block,
        const char * blockname,
        const char * dtype,
        int nmemb,
        int Nfile,
        const size_t fsize[],
        MPI_Comm comm)
{
    if(comm == MPI_COMM_NULL) return 0;
    int rank;
    MPI_Comm_rank(comm, &rank);

    int rt = 0;
    if (rank == 0) {
        rt = _big_file_mksubdir_r(bf->basename, blockname);
    } else {
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    char * basename = alloca(strlen(bf->basename) + strlen(blockname) + 128);
    sprintf(basename, "%s/%s/", bf->basename, blockname);
    return _big_block_mpi_create(block, basename, dtype, nmemb, Nfile, fsize, comm);
}